

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsort_wrapper.hpp
# Opt level: O1

void dss::construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,unsigned_int>
               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                begin,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      end,vector<unsigned_int,_std::allocator<unsigned_int>_> *SA)

{
  runtime_error *this;
  ulong __new_size;
  
  __new_size = (long)end._M_current - (long)begin._M_current;
  if ((long)(SA->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(SA->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start >> 2 != __new_size) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(SA,__new_size);
  }
  if (__new_size < 0x7fffffff) {
    divsufsort(begin._M_current,
               (SA->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start,__new_size & 0xffffffff);
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"Input size is too large for 32bit indexing.");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void construct(InputIterator begin, InputIterator end, std::vector<T>& SA)
{
    typedef typename std::iterator_traits<InputIterator>::value_type char_t;
    if (sizeof(char_t) != 1)
        throw std::runtime_error("Input must be a char type");
    std::size_t n = std::distance(begin, end);
    if (SA.size() != n)
        SA.resize(n);
    if (sizeof(T) == sizeof(saidx_t)) {
        if (n >= std::numeric_limits<saidx_t>::max())
            throw std::runtime_error("Input size is too large for 32bit indexing.");
        divsufsort(reinterpret_cast<const sauchar_t*>(&(*begin)), reinterpret_cast<saidx_t*>(&SA[0]), n);
    } else if (sizeof(T) == sizeof(saidx64_t)) {
        divsufsort64(reinterpret_cast<const sauchar_t*>(&(*begin)), reinterpret_cast<saidx64_t*>(&SA[0]), n);
    } else {
        throw std::runtime_error("Unsupported datatype of Suffix Array.");
    }
}